

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj,int fCompl)

{
  int iVar1;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_6c;
  int i;
  int nCubes;
  int Entry;
  Vec_Int_t *vSupp;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pFaninNew;
  Min_Cube_t *pCube;
  Min_Cube_t *pCover;
  int fCompl_local;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkNew_local;
  Cov_Man_t *p_local;
  
  if ((pObj->field_6).pTemp == (void *)0x0) {
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                    ,0x136,
                    "Abc_Obj_t *Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, int)"
                   );
    }
    p_00 = Abc_ObjGetSupp(pObj);
    pFaninNew = (Abc_Obj_t *)Abc_ObjGetCover2(pObj);
    if (p_00 == (Vec_Int_t *)0x0) {
      __assert_fail("vSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                    ,0x13b,
                    "Abc_Obj_t *Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, int)"
                   );
    }
    for (local_6c = 0; iVar1 = Vec_IntSize(p_00), local_6c < iVar1; local_6c = local_6c + 1) {
      iVar1 = Vec_IntEntry(p_00,local_6c);
      pAVar2 = Abc_NtkObj(pObj->pNtk,iVar1);
      Abc_NtkCovDeriveNodeInv_rec(p,pNtkNew,pAVar2,0);
    }
    iVar1 = Min_CoverCountCubes((Min_Cube_t *)pFaninNew);
    if (iVar1 == 0) {
      pFanin = Abc_NtkCreateNodeConst0(pNtkNew);
    }
    else if (iVar1 == 1) {
      pFanin = Abc_NtkCovDeriveCubeInv(pNtkNew,pObj,(Min_Cube_t *)pFaninNew,p_00);
    }
    else {
      pFanin = Abc_NtkCreateNode(pNtkNew);
      for (; pFaninNew != (Abc_Obj_t *)0x0; pFaninNew = (Abc_Obj_t *)pFaninNew->pNtk) {
        pAVar2 = Abc_NtkCovDeriveCubeInv(pNtkNew,pObj,(Min_Cube_t *)pFaninNew,p_00);
        Abc_ObjAddFanin(pFanin,pAVar2);
      }
      pcVar3 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtkNew->pManFunc,iVar1);
      (pFanin->field_5).pData = pcVar3;
    }
    (pObj->field_6).pCopy = pFanin;
    p_local = (Cov_Man_t *)Abc_NtkCovDeriveInv(pNtkNew,pObj,fCompl);
  }
  else {
    p_local = (Cov_Man_t *)Abc_NtkCovDeriveInv(pNtkNew,pObj,fCompl);
  }
  return (Abc_Obj_t *)p_local;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDeriveNodeInv_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, int fCompl )
{
    Min_Cube_t * pCover, * pCube;
    Abc_Obj_t * pFaninNew, * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    int Entry, nCubes, i;

    // skip if already computed
    if ( pObj->pCopy )
        return Abc_NtkCovDeriveInv( pNtkNew, pObj, fCompl );
    assert( Abc_ObjIsNode(pObj) );

    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    pCover = Abc_ObjGetCover2( pObj );
    assert( vSupp );

    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDeriveNodeInv_rec( p, pNtkNew, pFanin, 0 );
    }

    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCubeInv( pNtkNew, pObj, pCover, vSupp );
    else
    {
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Min_CoverForEachCube( pCover, pCube )
        {
            pFaninNew = Abc_NtkCovDeriveCubeInv( pNtkNew, pObj, pCube, vSupp );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        pNodeNew->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtkNew->pManFunc, nCubes );
    }

    pObj->pCopy = pNodeNew;
    return Abc_NtkCovDeriveInv( pNtkNew, pObj, fCompl );
}